

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVectorBase<slang::Diagnostic>::cleanup
          (SmallVectorBase<slang::Diagnostic> *this,EVP_PKEY_CTX *ctx)

{
  pointer pSVar1;
  vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *this_00;
  long lVar2;
  
  if (this->len != 0) {
    lVar2 = this->len * 0x70;
    this_00 = &this->data_->notes;
    do {
      std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::~vector(this_00);
      pSVar1 = (((vector<slang::SourceRange,_std::allocator<slang::SourceRange>_> *)(this_00 + -1))
               ->super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if (pSVar1 != (pointer)0x0) {
        operator_delete(pSVar1,(long)(((vector<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                                        *)(this_00 + -1))->
                                     super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pSVar1);
      }
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
      ::~vector((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
                 *)(this_00 + -2));
      this_00 = (vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *)
                ((long)(this_00 + 4) + 0x10);
      lVar2 = lVar2 + -0x70;
    } while (lVar2 != 0);
  }
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
    return;
  }
  return;
}

Assistant:

void cleanup() {
        std::destroy(begin(), end());
        if (!isSmall())
            free(data_);
    }